

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PreFilter.hpp
# Opt level: O0

void __thiscall
cppjieba::PreFilter::PreFilter
          (PreFilter *this,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *symbols,string *sentence)

{
  bool bVar1;
  ostream *poVar2;
  const_iterator pRVar3;
  undefined8 in_RSI;
  string *in_RDI;
  RuneStrArray *in_stack_fffffffffffffe38;
  undefined7 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe57;
  Logger *in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffecc;
  char *in_stack_fffffffffffffed0;
  size_t in_stack_fffffffffffffed8;
  Logger *in_stack_fffffffffffffee0;
  
  limonp::LocalVector<cppjieba::RuneStr>::LocalVector
            ((LocalVector<cppjieba::RuneStr> *)
             CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
  *(undefined8 *)(in_RDI + 0x160) = in_RSI;
  bVar1 = DecodeRunesInString(in_RDI,in_stack_fffffffffffffe38);
  if (!bVar1) {
    limonp::Logger::Logger
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
               in_stack_fffffffffffffecc);
    poVar2 = limonp::Logger::Stream((Logger *)&stack0xfffffffffffffe58);
    std::operator<<(poVar2,"decode failed. ");
    limonp::Logger::~Logger(in_stack_fffffffffffffe70);
  }
  pRVar3 = limonp::LocalVector<cppjieba::RuneStr>::begin
                     ((LocalVector<cppjieba::RuneStr> *)(in_RDI + 8));
  *(const_iterator *)in_RDI = pRVar3;
  return;
}

Assistant:

PreFilter(const unordered_set<Rune>& symbols, 
        const string& sentence)
    : symbols_(symbols) {
    if (!DecodeRunesInString(sentence, sentence_)) {
      XLOG(ERROR) << "decode failed. "; 
    }
    cursor_ = sentence_.begin();
  }